

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugTools.h
# Opt level: O2

bool cm::anon_unknown_0::dbg_impl<bool>(char *fname,int line,char *expr,bool value)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  allocator<char> local_69;
  string local_68;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CMAKE_NO_DBG",&local_69);
  cmSystemTools::GetEnvVar
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_48,&local_68);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_48._M_engaged == false) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                            );
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)fname);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(char *)CONCAT44(in_register_00000034,line));
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (bool)(char)expr;
}

Assistant:

T dbg_impl(const char* fname, int line, const char* expr, T value)
{
  if (!cmSystemTools::GetEnvVar("CMAKE_NO_DBG")) {
    std::cerr << fname << ':' << line << ": " << expr << " = " << value
              << std::endl;
  }
  return value;
}